

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputreader.cpp
# Opt level: O2

void __thiscall InputReader::trimLine(InputReader *this,string *line)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = std::__cxx11::string::find((char *)line,0x144b23);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)line,uVar1);
  }
  lVar2 = std::__cxx11::string::find_last_not_of((string *)line,0x157030);
  if (lVar2 != -1) {
    std::__cxx11::string::erase((ulong)line,lVar2 + 1);
    return;
  }
  return;
}

Assistant:

void InputReader::trimLine(string& line)
{
    // ... skip any characters following a ';'

    size_t pos = line.find(";");
    if (pos != string::npos) line.erase(pos);

    // ... trim any trailing whitespace

    pos = line.find_last_not_of(WHITESPACE);
    if (pos != string::npos) line.erase(pos + 1);
}